

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmGlobalGenerator::FindGeneratorTarget(cmGlobalGenerator *this,string *name)

{
  const_iterator cVar1;
  cmGeneratorTarget *pcVar2;
  _Base_ptr name_00;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->AliasTargets)._M_t,name);
  name_00 = cVar1._M_node + 2;
  if ((_Rb_tree_header *)cVar1._M_node == &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header)
  {
    name_00 = (_Base_ptr)name;
  }
  pcVar2 = FindGeneratorTargetImpl(this,(string *)name_00);
  return pcVar2;
}

Assistant:

cmGeneratorTarget* cmGlobalGenerator::FindGeneratorTarget(
  const std::string& name) const
{
  auto const ai = this->AliasTargets.find(name);
  if (ai != this->AliasTargets.end()) {
    return this->FindGeneratorTargetImpl(ai->second);
  }
  return this->FindGeneratorTargetImpl(name);
}